

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::Impl::copy_sub_create_info<VkPipelineLibraryCreateInfoKHR>
          (Impl *this,VkPipelineLibraryCreateInfoKHR **sub_info,ScratchAllocator *alloc,
          DynamicStateInfo *dynamic_state_info,VkGraphicsPipelineLibraryFlagsEXT state_flags)

{
  VkPipelineLibraryCreateInfoKHR *pVVar1;
  void *pvVar2;
  VkPipeline *ppVVar3;
  undefined4 uVar4;
  VkStructureType VVar5;
  undefined4 uVar6;
  bool bVar7;
  VkPipelineLibraryCreateInfoKHR *pVVar8;
  bool bVar9;
  void *pNext;
  void *local_38;
  
  pVVar1 = *sub_info;
  bVar9 = true;
  if (pVVar1 != (VkPipelineLibraryCreateInfoKHR *)0x0) {
    pVVar8 = (VkPipelineLibraryCreateInfoKHR *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
    if (pVVar8 != (VkPipelineLibraryCreateInfoKHR *)0x0) {
      VVar5 = pVVar1->sType;
      uVar6 = *(undefined4 *)&pVVar1->field_0x4;
      pvVar2 = pVVar1->pNext;
      uVar4 = *(undefined4 *)&pVVar1->field_0x14;
      ppVVar3 = pVVar1->pLibraries;
      pVVar8->libraryCount = pVVar1->libraryCount;
      *(undefined4 *)&pVVar8->field_0x14 = uVar4;
      pVVar8->pLibraries = ppVVar3;
      pVVar8->sType = VVar5;
      *(undefined4 *)&pVVar8->field_0x4 = uVar6;
      pVVar8->pNext = pvVar2;
    }
    *sub_info = pVVar8;
    local_38 = (void *)0x0;
    bVar7 = copy_pnext_chain(this,pVVar8->pNext,alloc,&local_38,dynamic_state_info,state_flags);
    if (bVar7) {
      (*sub_info)->pNext = local_38;
    }
    else {
      bVar9 = false;
    }
  }
  return bVar9;
}

Assistant:

bool StateRecorder::Impl::copy_sub_create_info(const SubCreateInfo *&sub_info, ScratchAllocator &alloc,
                                               const DynamicStateInfo *dynamic_state_info,
                                               VkGraphicsPipelineLibraryFlagsEXT state_flags)
{
	if (sub_info)
	{
		sub_info = copy(sub_info, 1, alloc);
		const void *pNext = nullptr;
		if (!copy_pnext_chain(sub_info->pNext, alloc, &pNext, dynamic_state_info, state_flags))
			return false;
		const_cast<SubCreateInfo *>(sub_info)->pNext = pNext;
	}

	return true;
}